

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.h
# Opt level: O2

void JsUtil::QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap
               (char *a,char *b,size_t size)

{
  char cVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  uint uVar7;
  
  if (a != b) {
    uVar7 = (uint)size;
    if (size < 8) {
      if (size < 4) {
        uVar6 = 0;
        while (uVar6 < size >> 1) {
          uVar2 = *(undefined2 *)a;
          *(undefined2 *)a = *(undefined2 *)b;
          *(undefined2 *)b = uVar2;
          uVar6 = 1;
        }
        uVar6 = (ulong)(uVar7 & 1);
      }
      else {
        uVar6 = (ulong)(uVar7 & 3);
        uVar3 = *(undefined4 *)a;
        *(undefined4 *)a = *(undefined4 *)b;
        *(undefined4 *)b = uVar3;
      }
    }
    else {
      for (uVar6 = 0; size >> 3 != uVar6; uVar6 = uVar6 + 1) {
        uVar4 = *(undefined8 *)(a + uVar6 * 8);
        *(undefined8 *)(a + uVar6 * 8) = *(undefined8 *)(b + uVar6 * 8);
        *(undefined8 *)(b + uVar6 * 8) = uVar4;
      }
      uVar6 = (ulong)(uVar7 & 7);
    }
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      cVar1 = a[uVar5];
      a[uVar5] = b[uVar5];
      b[uVar5] = cVar1;
    }
  }
  return;
}

Assistant:

static inline void swap(T* a, T* b, size_t size)
        {
            if (a == b) return;

            size_t mod;
            if (size >= 8)
            {
                mod = size & 7;
                CC_QSORT_SWAP_LOOP(CC_QSORT_SWAP8, (CC_QSORT_SWAP8*) a, (CC_QSORT_SWAP8*) b, size / 8)
            }
            else if (size >= 4)
            {
                mod = size & 3;
                CC_QSORT_SWAP_LOOP(CC_QSORT_SWAP4, (CC_QSORT_SWAP4*) a, (CC_QSORT_SWAP4*) b, size / 4)
            }
            else
            {
                mod = size & 1;
                CC_QSORT_SWAP_LOOP(CC_QSORT_SWAP2, (CC_QSORT_SWAP2*) a, (CC_QSORT_SWAP2*) b, size / 2)
            }

            CC_QSORT_SWAP_LOOP(char, (char*) a, (char*) b, mod);
        }